

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_Parser.h
# Opt level: O2

Value * __thiscall soul::heart::Parser::parseInt32Value(Value *__return_storage_ptr__,Parser *this)

{
  Type local_20;
  
  local_20.category = primitive;
  local_20.arrayElementCategory = invalid;
  local_20.isRef = false;
  local_20.isConstant = false;
  local_20.primitiveType.type = int32;
  local_20.boundingSize = 0;
  local_20.arrayElementBoundingSize = 0;
  local_20.structure.object = (Structure *)0x0;
  parseConstant(__return_storage_ptr__,this,&local_20,true);
  RefCountedPtr<soul::Structure>::~RefCountedPtr(&local_20.structure);
  return __return_storage_ptr__;
}

Assistant:

Value parseInt32Value()     { return parseConstant (PrimitiveType::int32, true); }